

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.c
# Opt level: O0

void do_gop(void *x,int n,char *op,int type,ARMCI_Group group)

{
  int iVar1;
  MPI_Datatype poVar2;
  MPI_Op poVar3;
  void *__src;
  char *in_RDX;
  int in_ESI;
  void *in_RDI;
  int in_R8D;
  MPI_Op mpi_op;
  void *result;
  int in_stack_00000018;
  int rc;
  MPI_Datatype mpi_type;
  int mpi_type_size;
  MPI_Comm comm;
  char *op_00;
  int local_2c;
  MPI_Comm local_28;
  int local_20;
  char *local_18;
  int local_c;
  void *local_8;
  
  local_28 = (MPI_Comm)&ompi_mpi_comm_null;
  local_2c = 0;
  op_00 = &ompi_mpi_op_null;
  local_20 = in_R8D;
  local_18 = in_RDX;
  local_c = in_ESI;
  local_8 = in_RDI;
  if (ARMCI_GROUP_SELF == in_R8D) {
    local_28 = (MPI_Comm)&ompi_mpi_comm_self;
  }
  else {
    local_28 = get_comm((ARMCI_Group *)&ompi_mpi_op_null);
  }
  poVar2 = armci_type_to_mpi_type((int)((ulong)op_00 >> 0x20));
  MPI_Type_size(poVar2,&local_2c);
  poVar3 = armci_op_to_mpi_op(op_00);
  iVar1 = strncmp(local_18,"absmin",6);
  if (iVar1 == 0) {
    do_abs(mpi_type,rc,in_stack_00000018);
  }
  else {
    iVar1 = strncmp(local_18,"absmax",6);
    if (iVar1 == 0) {
      do_abs(mpi_type,rc,in_stack_00000018);
    }
  }
  __src = malloc((long)(local_c * local_2c));
  if (__src == (void *)0x0) {
    __assert_fail("result",
                  "/workspace/llm4binary/github/license_c_cmakelists/GlobalArrays[P]ga/comex/src-armci/message.c"
                  ,0xd7,"void do_gop(void *, int, char *, int, ARMCI_Group)");
  }
  if (ARMCI_GROUP_SELF != local_20) {
    comex_barrier(x._4_4_);
  }
  iVar1 = MPI_Allreduce(local_8,__src,local_c,poVar2,poVar3,local_28);
  if (iVar1 != 0) {
    __assert_fail("rc == MPI_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/GlobalArrays[P]ga/comex/src-armci/message.c"
                  ,0xdd,"void do_gop(void *, int, char *, int, ARMCI_Group)");
  }
  memcpy(local_8,__src,(long)(local_2c * local_c));
  free(__src);
  return;
}

Assistant:

static void do_gop(void *x, int n, char* op, int type, ARMCI_Group group)
{
    MPI_Comm comm = MPI_COMM_NULL;
    int mpi_type_size = 0;
    MPI_Datatype mpi_type = MPI_DATATYPE_NULL;
    int rc = 0;
    void *result = NULL;
    MPI_Op mpi_op = MPI_OP_NULL;

    if (ARMCI_GROUP_SELF == group) {
        comm = MPI_COMM_SELF;
    }
    else {
        comm = get_comm(&group);
    }
    mpi_type = armci_type_to_mpi_type(type);
    MPI_Type_size(mpi_type, &mpi_type_size);
    mpi_op = armci_op_to_mpi_op(op);

    if (strncmp(op, "absmin", 6) == 0) {
        do_abs(x, n, type);
    }
    else if (strncmp(op, "absmax", 6) == 0) {
        do_abs(x, n, type);
    }
        
    result = malloc(n*mpi_type_size);
    assert(result);

    if (ARMCI_GROUP_SELF != group) {
        comex_barrier(group);
    }
    rc = MPI_Allreduce(x, result, n, mpi_type, mpi_op, comm); 
    assert(rc == MPI_SUCCESS);

    memcpy(x, result, mpi_type_size * n);
    free(result);
}